

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O3

tmbstr prvTidytmbstrdup(TidyAllocator *allocator,ctmbstr str)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  tmbstr ptVar4;
  long lVar5;
  size_t sVar6;
  
  if (str != (ctmbstr)0x0) {
    if (*str == '\0') {
      sVar6 = 1;
    }
    else {
      uVar3 = 1;
      do {
        pcVar1 = str + uVar3;
        uVar3 = uVar3 + 1;
      } while (*pcVar1 != '\0');
      sVar6 = uVar3 & 0xffffffff;
    }
    ptVar4 = (tmbstr)(*allocator->vtbl->alloc)(allocator,sVar6);
    lVar5 = 0;
    do {
      cVar2 = str[lVar5];
      ptVar4[lVar5] = cVar2;
      lVar5 = lVar5 + 1;
    } while (cVar2 != '\0');
    return ptVar4;
  }
  return (tmbstr)0x0;
}

Assistant:

tmbstr TY_(tmbstrdup)( TidyAllocator *allocator, ctmbstr str )
{
    tmbstr s = NULL;
    if ( str )
    {
        uint len = TY_(tmbstrlen)( str );
        tmbstr cp = s = (tmbstr) TidyAlloc( allocator, 1+len );
        while ( 0 != (*cp++ = *str++) )
            /**/;
    }
    return s;
}